

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

AActor * SpawnMapThing(int index,FMapThing *mt,int position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  AActor *ac;
  undefined4 extraout_var;
  char *pcVar8;
  PClass *pPVar7;
  
  ac = P_SpawnMapThing(mt,position);
  if (dumpspawnedthings.Value == true) {
    dVar1 = (mt->pos).X;
    dVar2 = (mt->pos).Y;
    dVar3 = (mt->pos).Z;
    sVar4 = mt->EdNum;
    uVar5 = mt->flags;
    if (ac == (AActor *)0x0) {
      pcVar8 = "(none)";
    }
    else {
      pPVar7 = (ac->super_DThinker).super_DObject.Class;
      if (pPVar7 == (PClass *)0x0) {
        iVar6 = (**(ac->super_DThinker).super_DObject._vptr_DObject)(ac);
        pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
        (ac->super_DThinker).super_DObject.Class = pPVar7;
      }
      pcVar8 = FName::NameData.NameArray
               [(pPVar7->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text;
    }
    Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",dVar1,dVar2,dVar3,
           index,(ulong)(uint)(int)sVar4,(ulong)uVar5,pcVar8);
  }
  T_AddSpawnedThing(ac);
  return ac;
}

Assistant:

AActor *SpawnMapThing(int index, FMapThing *mt, int position)
{
	AActor *spawned = P_SpawnMapThing(mt, position);
	if (dumpspawnedthings)
	{
		Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",
			index, mt->pos.X, mt->pos.Y, mt->pos.Z, mt->EdNum, mt->flags, 
			spawned? spawned->GetClass()->TypeName.GetChars() : "(none)");
	}
	T_AddSpawnedThing(spawned);
	return spawned;
}